

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_node.c
# Opt level: O3

void JPCommonNode_clear(JPCommonNode *node)

{
  if (node->pron != (char *)0x0) {
    free(node->pron);
    node->pron = (char *)0x0;
  }
  if (node->pos != (char *)0x0) {
    free(node->pos);
    node->pos = (char *)0x0;
  }
  if (node->ctype != (char *)0x0) {
    free(node->ctype);
    node->ctype = (char *)0x0;
  }
  if (node->cform != (char *)0x0) {
    free(node->cform);
    node->cform = (char *)0x0;
  }
  node->acc = 0;
  node->chain_flag = -1;
  node->prev = (_JPCommonNode *)0x0;
  node->next = (_JPCommonNode *)0x0;
  return;
}

Assistant:

void JPCommonNode_clear(JPCommonNode * node)
{
   if (node->pron != NULL) {
      free(node->pron);
      node->pron = NULL;
   }
   if (node->pos != NULL) {
      free(node->pos);
      node->pos = NULL;
   }
   if (node->ctype != NULL) {
      free(node->ctype);
      node->ctype = NULL;
   }
   if (node->cform != NULL) {
      free(node->cform);
      node->cform = NULL;
   }
   node->acc = 0;
   node->chain_flag = -1;
   node->prev = NULL;
   node->next = NULL;
}